

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O3

Cards * __thiscall
solitaire::piles::TableauPile::tryPullOutCards
          (Cards *__return_storage_ptr__,TableauPile *this,uint quantity)

{
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  __last;
  Cards *pulledOutCards;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  __first;
  allocator_type local_19;
  
  __last._M_current =
       (this->cards).
       super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (((long)__last._M_current -
       (long)(this->cards).
             super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) - (ulong)this->topCoveredCardPosition <
      (ulong)quantity) {
    (__return_storage_ptr__->
    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    __first._M_current = __last._M_current + -(ulong)quantity;
    std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>::
    vector<__gnu_cxx::__normal_iterator<solitaire::cards::Card*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>,void>
              ((vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>> *)
               __return_storage_ptr__,__first,__last,&local_19);
    if (__first._M_current !=
        (this->cards).
        super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->cards).
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
      super__Vector_impl_data._M_finish = __first._M_current;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Cards TableauPile::tryPullOutCards(unsigned quantity) {
    if (shouldPullOutCards(quantity)) {
        const auto firstCardToPullOut = std::prev(cards.end(), quantity);
        const Cards pulledOutCards {firstCardToPullOut, cards.end()};
        cards.erase(firstCardToPullOut, cards.end());
        return pulledOutCards;
    }

    return Cards {};
}